

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

QWindow * __thiscall QFbScreen::topWindow(QFbScreen *this)

{
  long lVar1;
  int iVar2;
  QWindow *pQVar3;
  long lVar4;
  
  lVar1 = *(long *)(this + 0x30);
  if (lVar1 != 0) {
    lVar4 = 0;
    do {
      QPlatformWindow::window();
      iVar2 = QWindow::type();
      if (iVar2 == 1) {
LAB_001131ad:
        pQVar3 = (QWindow *)QPlatformWindow::window();
        return pQVar3;
      }
      QPlatformWindow::window();
      iVar2 = QWindow::type();
      if (iVar2 == 3) goto LAB_001131ad;
      lVar4 = lVar4 + 8;
    } while (lVar1 << 3 != lVar4);
  }
  return (QWindow *)0x0;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }